

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

int mpz_cmp_ui(__mpz_struct *u,unsigned_long v)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  mp_size_t usize;
  unsigned_long v_local;
  __mpz_struct *u_local;
  
  if (u->_mp_size < 2) {
    if (u->_mp_size < 0) {
      u_local._4_4_ = -1;
    }
    else {
      uVar1 = mpz_get_ui(u);
      uVar2 = mpz_get_ui(u);
      u_local._4_4_ = (uint)(v < uVar1) - (uint)(uVar2 < v);
    }
  }
  else {
    u_local._4_4_ = 1;
  }
  return u_local._4_4_;
}

Assistant:

int
mpz_cmp_ui (const mpz_t u, unsigned long v)
{
  mp_size_t usize = u->_mp_size;

  if (usize > 1)
    return 1;
  else if (usize < 0)
    return -1;
  else
    return GMP_CMP (mpz_get_ui (u), v);
}